

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTC.cc
# Opt level: O0

bool tc_active(char *scope)

{
  bool bVar1;
  bool local_72;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  string value;
  char *scope_local;
  
  value.field_2._8_8_ = scope;
  std::__cxx11::string::string((string *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"TC_SCOPE",&local_51);
  bVar1 = QUtil::get_env(&local_50,(string *)local_30);
  local_72 = false;
  if (bVar1) {
    local_72 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_30,(char *)value.field_2._8_8_);
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::__cxx11::string::~string((string *)local_30);
  return local_72;
}

Assistant:

static bool
tc_active(char const* const scope)
{
    std::string value;
    return (QUtil::get_env("TC_SCOPE", &value) && (value == scope));
}